

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O2

void __thiscall CodeGen::generateEnumTraits(CodeGen *this,NodePtr *n)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  string last;
  string first;
  string fn;
  string dname;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  string local_60;
  string local_40;
  
  iVar1 = (*n->px->_vptr_Node[3])();
  std::__cxx11::string::string((string *)&local_40,(string *)(CONCAT44(extraout_var,iVar1) + 0x20));
  fullname(&local_60,this,&local_40);
  iVar1 = (*n->px->_vptr_Node[7])();
  local_80 = local_70;
  local_78 = 0;
  local_a0 = local_90;
  local_98 = 0;
  local_70[0] = 0;
  local_90[0] = 0;
  if ((this->ns_)._M_string_length == 0) {
    (*n->px->_vptr_Node[8])(n->px,0);
    std::__cxx11::string::_M_assign((string *)&local_80);
    (*n->px->_vptr_Node[8])(n->px,(ulong)(iVar1 - 1));
    std::__cxx11::string::_M_assign((string *)&local_a0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_80);
    std::__cxx11::string::append((char *)&local_80);
    (*n->px->_vptr_Node[8])(n->px,0);
    std::__cxx11::string::append((string *)&local_80);
    std::__cxx11::string::_M_assign((string *)&local_a0);
    std::__cxx11::string::append((char *)&local_a0);
    (*n->px->_vptr_Node[8])(n->px,(ulong)(iVar1 - 1));
    std::__cxx11::string::append((string *)&local_a0);
  }
  poVar2 = std::operator<<(this->os_,"template<> struct codec_traits<");
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  poVar2 = std::operator<<(poVar2,"> {\n");
  poVar2 = std::operator<<(poVar2,"    static void encode(Encoder& e, ");
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  poVar2 = std::operator<<(poVar2," v) {\n");
  poVar2 = std::operator<<(poVar2,"\t\tif (v < ");
  poVar2 = std::operator<<(poVar2,(string *)&local_80);
  poVar2 = std::operator<<(poVar2," || v > ");
  poVar2 = std::operator<<(poVar2,(string *)&local_a0);
  poVar2 = std::operator<<(poVar2,")\n");
  poVar2 = std::operator<<(poVar2,"\t\t{\n");
  poVar2 = std::operator<<(poVar2,"\t\t\tstd::ostringstream error;\n");
  poVar2 = std::operator<<(poVar2,"\t\t\terror << \"enum value \" << v << \" is out of bound for ");
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  poVar2 = std::operator<<(poVar2," and cannot be encoded\";\n");
  poVar2 = std::operator<<(poVar2,"\t\t\tthrow avro::Exception(error.str());\n");
  poVar2 = std::operator<<(poVar2,"\t\t}\n");
  poVar2 = std::operator<<(poVar2,"        e.encodeEnum(v);\n");
  poVar2 = std::operator<<(poVar2,"    }\n");
  poVar2 = std::operator<<(poVar2,"    static void decode(Decoder& d, ");
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  poVar2 = std::operator<<(poVar2,"& v) {\n");
  poVar2 = std::operator<<(poVar2,"\t\tsize_t index = d.decodeEnum();\n");
  poVar2 = std::operator<<(poVar2,"\t\tif (index < ");
  poVar2 = std::operator<<(poVar2,(string *)&local_80);
  poVar2 = std::operator<<(poVar2," || index > ");
  poVar2 = std::operator<<(poVar2,(string *)&local_a0);
  poVar2 = std::operator<<(poVar2,")\n");
  poVar2 = std::operator<<(poVar2,"\t\t{\n");
  poVar2 = std::operator<<(poVar2,"\t\t\tstd::ostringstream error;\n");
  poVar2 = std::operator<<(poVar2,
                           "\t\t\terror << \"enum value \" << index << \" is out of bound for ");
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  poVar2 = std::operator<<(poVar2," and cannot be decoded\";\n");
  poVar2 = std::operator<<(poVar2,"\t\t\tthrow avro::Exception(error.str());\n");
  poVar2 = std::operator<<(poVar2,"\t\t}\n");
  poVar2 = std::operator<<(poVar2,"        v = static_cast<");
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  poVar2 = std::operator<<(poVar2,">(index);\n");
  poVar2 = std::operator<<(poVar2,"    }\n");
  std::operator<<(poVar2,"};\n\n");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void CodeGen::generateEnumTraits(const NodePtr& n)
{
	string dname = decorate(n->name());
	string fn = fullname(dname);
	size_t c = n->names();
	string first; 
	string last;
	if (!ns_.empty())
	{
		first = ns_;
		first += "::";
		first += n->nameAt(0);

		last = ns_;
		last += "::";
		last += n->nameAt(c-1);
	} else {
		first = n->nameAt(0);
		last = n->nameAt(c-1);
	}
	os_ << "template<> struct codec_traits<" << fn << "> {\n"
		<< "    static void encode(Encoder& e, " << fn << " v) {\n"
		<< "		if (v < "  << first << " || v > " << last << ")\n" 
		<< "		{\n"
		<< "			std::ostringstream error;\n"
		<< "			error << \"enum value \" << v << \" is out of bound for " << fn << " and cannot be encoded\";\n"
		<< "			throw avro::Exception(error.str());\n"
		<< "		}\n"
		<< "        e.encodeEnum(v);\n"
		<< "    }\n"
		<< "    static void decode(Decoder& d, " << fn << "& v) {\n"
		<< "		size_t index = d.decodeEnum();\n"
		<< "		if (index < " << first << " || index > " << last << ")\n" 
		<< "		{\n"
		<< "			std::ostringstream error;\n"
		<< "			error << \"enum value \" << index << \" is out of bound for " << fn << " and cannot be decoded\";\n"
		<< "			throw avro::Exception(error.str());\n"
		<< "		}\n"
		<< "        v = static_cast<" << fn << ">(index);\n"
		<< "    }\n"
		<< "};\n\n";
}